

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * fmt::v5::internal::
       parse_arg_id<char,fmt::v5::internal::width_adapter<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>&,char>>
                 (char *begin,char *end,
                 width_adapter<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_&,_char>
                 *handler)

{
  byte bVar1;
  char cVar2;
  dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
  *pdVar3;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *pbVar4;
  dynamic_format_specs<char> *pdVar5;
  byte *pbVar6;
  byte *pbVar7;
  char *pcVar8;
  uint uVar9;
  byte *pbVar10;
  
  bVar1 = *begin;
  if ((bVar1 == 0x7d) || (bVar1 == 0x3a)) {
    pdVar3 = handler->handler;
    pbVar4 = pdVar3->context_;
    uVar9 = pbVar4->next_arg_id_;
    if ((int)uVar9 < 0) {
      error_handler::on_error
                ((error_handler *)pbVar4,"cannot switch from manual to automatic argument indexing")
      ;
      uVar9 = 0;
    }
    else {
      pbVar4->next_arg_id_ = uVar9 + 1;
    }
    pdVar5 = pdVar3->specs_;
    (pdVar5->width_ref).kind = INDEX;
    (pdVar5->width_ref).field_1.index = uVar9;
  }
  else {
    if ((byte)(bVar1 - 0x30) < 10) {
      begin = begin + 1;
      uVar9 = 0;
      pcVar8 = begin;
      if (bVar1 != 0x30) {
        while (uVar9 < 0xccccccd) {
          uVar9 = ((int)pcVar8[-1] + uVar9 * 10) - 0x30;
          begin = end;
          if ((pcVar8 == end) ||
             (cVar2 = *pcVar8, begin = pcVar8, pcVar8 = pcVar8 + 1, 9 < (byte)(cVar2 - 0x30U)))
          goto LAB_001d7062;
        }
        uVar9 = 0x80000000;
        begin = pcVar8 + -1;
LAB_001d7062:
        if ((int)uVar9 < 0) {
          error_handler::on_error((error_handler *)handler->handler->context_,"number is too big");
        }
      }
      if ((begin != end) && ((*begin == ':' || (*begin == '}')))) {
        pdVar3 = handler->handler;
        pbVar4 = pdVar3->context_;
        if (pbVar4->next_arg_id_ < 1) {
          pbVar4->next_arg_id_ = -1;
        }
        else {
          error_handler::on_error
                    ((error_handler *)pbVar4,
                     "cannot switch from automatic to manual argument indexing");
        }
        pdVar5 = pdVar3->specs_;
        (pdVar5->width_ref).kind = INDEX;
        (pdVar5->width_ref).field_1.index = uVar9;
        return begin;
      }
    }
    else if ((bVar1 == 0x5f) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) {
      pbVar7 = (byte *)(begin + 1);
      do {
        pbVar6 = pbVar7;
        pbVar10 = (byte *)end;
        if (pbVar6 == (byte *)end) break;
        bVar1 = *pbVar6;
        pbVar7 = pbVar6 + 1;
      } while ((((byte)(bVar1 - 0x30) < 10) || (bVar1 == 0x5f)) ||
              (pbVar10 = pbVar6, (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
      pdVar5 = handler->handler->specs_;
      (pdVar5->width_ref).kind = NAME;
      (pdVar5->width_ref).field_1.name.value = begin;
      (pdVar5->width_ref).field_1.name.size = (long)pbVar10 - (long)begin;
      return (char *)pbVar10;
    }
    error_handler::on_error((error_handler *)handler->handler->context_,"invalid format string");
  }
  return begin;
}

Assistant:

FMT_CONSTEXPR const Char *parse_arg_id(
    const Char *begin, const Char *end, IDHandler &&handler) {
  assert(begin != end);
  Char c = *begin;
  if (c == '}' || c == ':')
    return handler(), begin;
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(begin, end, handler);
    if (begin == end || (*begin != '}' && *begin != ':'))
      return handler.on_error("invalid format string"), begin;
    handler(index);
    return begin;
  }
  if (!is_name_start(c))
    return handler.on_error("invalid format string"), begin;
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}